

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall cmake::SetDirectoriesFromFile(cmake *this,string *arg)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  __type _Var5;
  ulong uVar6;
  pointer this_00;
  string *psVar7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  byte local_519;
  __type local_509;
  bool local_4b9;
  undefined1 local_450 [8];
  string cwd_2;
  string full_1;
  string full;
  string cwd_1;
  string cwd;
  bool used_provided_path;
  bool passed_same_path;
  bool no_build_tree;
  bool no_source_tree;
  string local_3a0;
  cmValue local_380;
  cmValue existingValue;
  string local_2f8;
  undefined1 local_2d8 [8];
  string name_1;
  string fullPath_1;
  string local_248;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  string local_1f8;
  undefined1 local_1d8 [8];
  string name;
  string fullPath;
  cmAlphaNum local_168;
  undefined1 local_138 [8];
  string listFile;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string cacheFile;
  string path;
  bool local_62;
  bool local_61;
  undefined1 local_60 [6];
  bool is_empty_directory;
  bool is_source_dir;
  string cachePath;
  string listPath;
  string *arg_local;
  cmake *this_local;
  
  std::__cxx11::string::string((string *)(cachePath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  local_61 = false;
  local_62 = false;
  bVar2 = cmsys::SystemTools::FileIsDirectory(arg);
  if (bVar2) {
    cmsys::SystemTools::CollapseFullPath((string *)((long)&cacheFile.field_2 + 8),arg);
    cmsys::SystemTools::ConvertToUnixSlashes((string *)((long)&cacheFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_e8,(string *)((long)&cacheFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&listFile.field_2 + 8),"/CMakeCache.txt");
    cmStrCat<>((string *)local_b8,&local_e8,(cmAlphaNum *)((long)&listFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_168,(string *)((long)&cacheFile.field_2 + 8));
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fullPath.field_2 + 8),"/CMakeLists.txt");
    cmStrCat<>((string *)local_138,&local_168,(cmAlphaNum *)((long)&fullPath.field_2 + 8));
    local_62 = cmsys::SystemTools::FileExists((string *)local_b8);
    if (local_62) {
      std::__cxx11::string::operator=
                ((string *)local_60,(string *)(cacheFile.field_2._M_local_buf + 8));
    }
    local_62 = !local_62;
    local_61 = cmsys::SystemTools::FileExists((string *)local_138);
    if (local_61) {
      std::__cxx11::string::operator=
                ((string *)(cachePath.field_2._M_local_buf + 8),
                 (string *)(cacheFile.field_2._M_local_buf + 8));
      local_62 = false;
    }
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)(cacheFile.field_2._M_local_buf + 8));
  }
  else {
    bVar2 = cmsys::SystemTools::FileExists(arg);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&name.field_2 + 8),arg);
      cmsys::SystemTools::GetFilenameName((string *)local_1d8,(string *)((long)&name.field_2 + 8));
      cmsys::SystemTools::LowerCase(&local_1f8,(string *)local_1d8);
      std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      local_208 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d8);
      local_228 = (basic_string_view<char,_std::char_traits<char>_>)
                  ::cm::operator____s("cmakecache.txt",0xe);
      local_218 = local_228;
      bVar2 = std::operator==(local_208,local_228);
      if (bVar2) {
        cmsys::SystemTools::GetFilenamePath(&local_248,(string *)((long)&name.field_2 + 8));
        std::__cxx11::string::operator=((string *)local_60,(string *)&local_248);
        std::__cxx11::string::~string((string *)&local_248);
      }
      else {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1d8);
        bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("cmakelists.txt",0xe);
        bVar2 = std::operator==(_Var1,bVar8);
        if (bVar2) {
          cmsys::SystemTools::GetFilenamePath
                    ((string *)((long)&fullPath_1.field_2 + 8),(string *)((long)&name.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(cachePath.field_2._M_local_buf + 8),
                     (string *)(fullPath_1.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(fullPath_1.field_2._M_local_buf + 8));
        }
      }
      std::__cxx11::string::~string((string *)local_1d8);
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
    }
    else {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&name_1.field_2 + 8),arg);
      cmsys::SystemTools::GetFilenameName((string *)local_2d8,(string *)((long)&name_1.field_2 + 8))
      ;
      cmsys::SystemTools::LowerCase(&local_2f8,(string *)local_2d8);
      std::__cxx11::string::operator=((string *)local_2d8,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2d8);
      bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
              ::cm::operator____s("cmakecache.txt",0xe);
      bVar2 = std::operator==(_Var1,bVar8);
      local_4b9 = true;
      if (!bVar2) {
        _Var1 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_2d8);
        bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
                ::cm::operator____s("cmakelists.txt",0xe);
        local_4b9 = std::operator==(_Var1,bVar8);
      }
      if (local_4b9 == false) {
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),
                   (string *)(name_1.field_2._M_local_buf + 8));
      }
      else {
        cmsys::SystemTools::GetFilenamePath
                  ((string *)&existingValue,(string *)((long)&name_1.field_2 + 8));
        std::__cxx11::string::operator=
                  ((string *)(cachePath.field_2._M_local_buf + 8),(string *)&existingValue);
        std::__cxx11::string::~string((string *)&existingValue);
      }
      std::__cxx11::string::~string((string *)local_2d8);
      std::__cxx11::string::~string((string *)(name_1.field_2._M_local_buf + 8));
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    bVar2 = LoadCache(this,(string *)local_60);
    if (bVar2) {
      this_00 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a0,"CMAKE_HOME_DIRECTORY",(allocator<char> *)&no_source_tree);
      local_380 = cmState::GetCacheEntryValue(this_00,&local_3a0);
      std::__cxx11::string::~string((string *)&local_3a0);
      std::allocator<char>::~allocator((allocator<char> *)&no_source_tree);
      bVar2 = cmValue::operator_cast_to_bool(&local_380);
      if (bVar2) {
        SetHomeOutputDirectory(this,(string *)local_60);
        psVar7 = cmValue::operator*[abi_cxx11_(&local_380);
        SetHomeDirectory(this,psVar7);
        this_local._7_1_ = true;
        goto LAB_0051b75a;
      }
    }
  }
  GetHomeDirectory_abi_cxx11_(this);
  bVar3 = std::__cxx11::string::empty();
  GetHomeOutputDirectory_abi_cxx11_(this);
  bVar4 = std::__cxx11::string::empty();
  psVar7 = GetHomeDirectory_abi_cxx11_(this);
  _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&cachePath.field_2 + 8),psVar7);
  local_509 = true;
  if (!_Var5) {
    psVar7 = GetHomeOutputDirectory_abi_cxx11_(this);
    local_509 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&cachePath.field_2 + 8),psVar7);
  }
  local_519 = 1;
  if ((local_509 == false) && (local_519 = 1, local_61 == false)) {
    local_519 = bVar4;
  }
  cwd.field_2._M_local_buf[0xc] = local_519 & 1;
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    if (local_61 == false) {
      if (((bVar3 & 1) == 0) || ((bVar4 & 1) == 0)) {
        if ((bVar4 & 1) != 0) {
          SetHomeOutputDirectory(this,(string *)((long)&cachePath.field_2 + 8));
        }
      }
      else {
        SetHomeDirectory(this,(string *)((long)&cachePath.field_2 + 8));
        cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
        SetHomeOutputDirectory(this,(string *)((long)&full.field_2 + 8));
        std::__cxx11::string::~string((string *)(full.field_2._M_local_buf + 8));
      }
    }
    else {
      SetHomeDirectoryViaCommandLine(this,(string *)((long)&cachePath.field_2 + 8));
      if ((bVar4 & 1) != 0) {
        cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
        SetHomeOutputDirectory(this,(string *)((long)&cwd_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(cwd_1.field_2._M_local_buf + 8));
      }
    }
  }
  else {
    if ((bVar3 & 1) != 0) {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&full_1.field_2 + 8),arg);
      SetHomeDirectory(this,(string *)((long)&full_1.field_2 + 8));
      std::__cxx11::string::~string((string *)(full_1.field_2._M_local_buf + 8));
    }
    if ((((bVar4 & 1) == 0) || ((bVar3 & 1) != 0)) || (!local_62)) {
      if ((bVar4 & 1) != 0) {
        cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
        SetHomeOutputDirectory(this,(string *)local_450);
        cwd.field_2._M_local_buf[0xc] = '\0';
        std::__cxx11::string::~string((string *)local_450);
      }
    }
    else {
      cmsys::SystemTools::CollapseFullPath((string *)((long)&cwd_2.field_2 + 8),arg);
      SetHomeOutputDirectory(this,(string *)((long)&cwd_2.field_2 + 8));
      std::__cxx11::string::~string((string *)(cwd_2.field_2._M_local_buf + 8));
    }
  }
  this_local._7_1_ = (bool)cwd.field_2._M_local_buf[0xc];
LAB_0051b75a:
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(cachePath.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool cmake::SetDirectoriesFromFile(const std::string& arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool is_source_dir = false;
  bool is_empty_directory = false;
  if (cmSystemTools::FileIsDirectory(arg)) {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = cmStrCat(path, "/CMakeCache.txt");
    std::string listFile = cmStrCat(path, "/CMakeLists.txt");

    is_empty_directory = true;
    if (cmSystemTools::FileExists(cacheFile)) {
      cachePath = path;
      is_empty_directory = false;
    }
    if (cmSystemTools::FileExists(listFile)) {
      listPath = path;
      is_empty_directory = false;
      is_source_dir = true;
    }
  } else if (cmSystemTools::FileExists(arg)) {
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s) {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
    } else if (name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    }
  } else {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if (name == "cmakecache.txt"_s || name == "cmakelists.txt"_s) {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
    } else {
      listPath = fullPath;
    }
  }

  // If there is a CMakeCache.txt file, use its settings.
  if (!cachePath.empty()) {
    if (this->LoadCache(cachePath)) {
      cmValue existingValue =
        this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue) {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(*existingValue);
        return true;
      }
    }
  }

  bool no_source_tree = this->GetHomeDirectory().empty();
  bool no_build_tree = this->GetHomeOutputDirectory().empty();

  // When invoked with a path that points to an existing CMakeCache
  // This function is called multiple times with the same path
  const bool passed_same_path = (listPath == this->GetHomeDirectory()) ||
    (listPath == this->GetHomeOutputDirectory());
  bool used_provided_path =
    (passed_same_path || is_source_dir || no_build_tree);

  // If there is a CMakeLists.txt file, use it as the source tree.
  if (!listPath.empty()) {
    // When invoked with a path that points to an existing CMakeCache
    // This function is called multiple times with the same path
    if (is_source_dir) {
      this->SetHomeDirectoryViaCommandLine(listPath);
      if (no_build_tree) {
        std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
        this->SetHomeOutputDirectory(cwd);
      }
    } else if (no_source_tree && no_build_tree) {
      this->SetHomeDirectory(listPath);

      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
    } else if (no_build_tree) {
      this->SetHomeOutputDirectory(listPath);
    }
  } else {
    if (no_source_tree) {
      // We didn't find a CMakeLists.txt and it wasn't specified
      // with -S. Assume it is the path to the source tree
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeDirectory(full);
    }
    if (no_build_tree && !no_source_tree && is_empty_directory) {
      // passed `-S <path> <build_dir> when build_dir is an empty directory
      std::string full = cmSystemTools::CollapseFullPath(arg);
      this->SetHomeOutputDirectory(full);
    } else if (no_build_tree) {
      // We didn't find a CMakeCache.txt and it wasn't specified
      // with -B. Assume the current working directory as the build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      used_provided_path = false;
    }
  }

  return used_provided_path;
}